

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O1

bool __thiscall BinGE<0,_4,_0>::propagate(BinGE<0,_4,_0> *this)

{
  IntVar *pIVar1;
  IntVar *pIVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  long lVar6;
  int64_t m_v;
  long lVar7;
  TrailElem local_30;
  
  pIVar1 = (this->x).var;
  pIVar2 = (this->y).var;
  lVar6 = (long)(pIVar1->max).v;
  lVar7 = (long)(this->y).b + (long)(pIVar2->min).v;
  if ((pIVar1->min).v < lVar7) {
    if (so.lazy) {
      iVar3 = (*(pIVar2->super_Var).super_Branching._vptr_Branching[8])();
      lVar4 = (long)iVar3 * 4 + 2;
    }
    else {
      lVar4 = 0;
    }
    pIVar1 = (this->x).var;
    iVar3 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xe])(pIVar1,lVar7,lVar4,1);
    if ((char)iVar3 != '\0') goto LAB_001b589a;
LAB_001b5940:
    bVar5 = false;
  }
  else {
LAB_001b589a:
    if (lVar6 < (long)(this->y).b + (long)(((this->y).var)->max).v) {
      if (so.lazy == true) {
        iVar3 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[9])();
        lVar7 = (long)iVar3 * 4 + 2;
      }
      else {
        lVar7 = 0;
      }
      pIVar1 = (this->y).var;
      iVar3 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xf])
                        (pIVar1,lVar6 - (this->y).b,lVar7,1);
      if ((char)iVar3 == '\0') goto LAB_001b5940;
    }
    bVar5 = true;
    if ((long)(this->y).b + (long)(((this->y).var)->max).v <= (long)(((this->x).var)->min).v) {
      local_30.pt = (int *)&(this->super_Propagator).satisfied;
      local_30.x = (int)(this->super_Propagator).satisfied.v;
      local_30.sz = 1;
      vec<TrailElem>::push(&engine.trail,&local_30);
      (this->super_Propagator).satisfied.v = '\x01';
    }
  }
  return bVar5;
}

Assistant:

bool propagate() override {
		if ((R != 0) && r.isFalse()) {
			return true;
		}

		const int64_t x_max = x.getMax();
		const int64_t y_min = y.getMin();

		// Can finesse!!
		if ((R != 0) && x_max < y_min) {
			setDom(r, setVal, 0, x.getMaxLit(), y.getMinLit());
		}

		if ((R != 0) && !r.isTrue()) {
			return true;
		}

		// Finesses x's lower bound
		if (R != 0) {
			setDom(x, setMin, y_min, y.getMinLit(), r.getValLit());
		} else {
			setDom(x, setMin, y_min, y.getMinLit());
		}
		if (R != 0) {
			setDom(y, setMax, x_max, x.getMaxLit(), r.getValLit());
		} else {
			setDom(y, setMax, x_max, x.getMaxLit());
		}

		if (x.getMin() >= y.getMax()) {
			satisfied = true;
		}

		return true;
	}